

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::ServiceDescriptorProto::_InternalParse
          (ServiceDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  MethodDescriptorProto *msg;
  ServiceOptions *msg_00;
  uint uVar2;
  char cVar3;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  local_40 = ptr;
LAB_002beef3:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_40);
    if (bVar1) {
      return local_40;
    }
    local_40 = internal::ReadTag(local_40,&local_34,0);
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
    uVar2 = local_34 >> 3;
    cVar3 = (char)local_34;
    if (uVar2 == 3) {
      if (cVar3 != '\x1a') goto LAB_002befcc;
      msg_00 = _internal_mutable_options(this);
      local_40 = internal::ParseContext::ParseMessage<google::protobuf::ServiceOptions>
                           (ctx,msg_00,local_40);
    }
    else {
      if (uVar2 == 2) {
        if (cVar3 == '\x12') {
          local_40 = local_40 + -1;
          do {
            local_40 = local_40 + 1;
            msg = RepeatedPtrField<google::protobuf::MethodDescriptorProto>::Add(&this->method_);
            local_40 = internal::ParseContext::ParseMessage<google::protobuf::MethodDescriptorProto>
                                 (ctx,msg,local_40);
            if (local_40 == (char *)0x0) {
              return (char *)0x0;
            }
          } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == '\x12'))
          ;
          goto LAB_002beef3;
        }
      }
      else if ((uVar2 == 1) && (cVar3 == '\n')) {
        s = _internal_mutable_name_abi_cxx11_(this);
        local_40 = internal::InlineGreedyStringParser(s,local_40,ctx);
        goto LAB_002befe8;
      }
LAB_002befcc:
      if ((local_34 == 0) || ((local_34 & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
        return local_40;
      }
      local_40 = internal::UnknownFieldParse(local_34,&this->_internal_metadata_,local_40,ctx);
    }
LAB_002befe8:
    if (local_40 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ServiceDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.ServiceDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.MethodDescriptorProto method = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_method(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.ServiceOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}